

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O0

int run_test_we_get_signals(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint i;
  uv_loop_t *loop;
  timer_ctx tc [2];
  signal_ctx sc [4];
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  start_watcher(loop_00,10,(signal_ctx *)&tc[1].signum,0);
  start_watcher(loop_00,10,(signal_ctx *)&sc[0].signum,0);
  start_watcher(loop_00,0xc,(signal_ctx *)&sc[1].signum,0);
  start_watcher(loop_00,0xc,(signal_ctx *)&sc[2].signum,0);
  start_timer(loop_00,10,(timer_ctx *)&loop);
  start_timer(loop_00,0xc,(timer_ctx *)&tc[0].signum);
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0xcc,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = 0;
  while( true ) {
    if (3 < eval_a._4_4_) {
      eval_a._4_4_ = 0;
      while( true ) {
        if (1 < eval_a._4_4_) {
          close_loop(loop_00);
          iVar1 = uv_loop_close(loop_00);
          if ((long)iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
                    ,0xd4,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
            abort();
          }
          uv_library_shutdown();
          return 0;
        }
        if ((ulong)(uint)tc[(ulong)eval_a._4_4_ - 1].signum != 10) break;
        eval_a._4_4_ = eval_a._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
              ,0xd2,"tc[i].ncalls","==","10",(ulong)(uint)tc[(ulong)eval_a._4_4_ - 1].signum,"==",10
             );
      abort();
    }
    if ((ulong)*(uint *)&tc[(ulong)eval_a._4_4_ + 1].field_0x84 != 10) break;
    eval_a._4_4_ = eval_a._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,0xcf,"sc[i].ncalls","==","10",(ulong)*(uint *)&tc[(ulong)eval_a._4_4_ + 1].field_0x84,
          "==",10);
  abort();
}

Assistant:

TEST_IMPL(we_get_signals) {
  struct signal_ctx sc[4];
  struct timer_ctx tc[2];
  uv_loop_t* loop;
  unsigned int i;

  loop = uv_default_loop();
  start_watcher(loop, SIGUSR1, sc + 0, 0);
  start_watcher(loop, SIGUSR1, sc + 1, 0);
  start_watcher(loop, SIGUSR2, sc + 2, 0);
  start_watcher(loop, SIGUSR2, sc + 3, 0);
  start_timer(loop, SIGUSR1, tc + 0);
  start_timer(loop, SIGUSR2, tc + 1);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  for (i = 0; i < ARRAY_SIZE(sc); i++)
    ASSERT_EQ(sc[i].ncalls, NSIGNALS);

  for (i = 0; i < ARRAY_SIZE(tc); i++)
    ASSERT_EQ(tc[i].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}